

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_lfdepx(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 EA;
  TCGv_i64 val;
  uintptr_t o;
  uintptr_t o_1;
  
  if (ctx->pr == true) {
    gen_priv_exception(ctx,1);
    return;
  }
  if (ctx->fpu_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    gen_set_access_type(ctx,0x30);
    EA = tcg_temp_new_i64(tcg_ctx);
    val = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx,EA);
    tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,val,EA,8,ctx->default_tcg_memop_mask | MO_64);
    set_fpr(tcg_ctx,ctx->opcode >> 0x15 & 0x1f,val);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_lfdepx(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv EA;
    TCGv_i64 t0;
    CHK_SV;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    gen_set_access_type(ctx, ACCESS_FLOAT);
    EA = tcg_temp_new(tcg_ctx);
    t0 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_reg_index(ctx, EA);
    tcg_gen_qemu_ld_i64(tcg_ctx, t0, EA, PPC_TLB_EPID_LOAD, DEF_MEMOP(MO_Q));
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);
    tcg_temp_free(tcg_ctx, EA);
    tcg_temp_free_i64(tcg_ctx, t0);
}